

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl<long,void>
          (ParserRefImpl<Catch::Clara::Opt> *this,long *ref,StringRef hint)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  element_type *in_RDX;
  shared_ptr<Catch::Clara::Detail::BoundRef> *in_RDI;
  shared_ptr<Catch::Clara::Detail::BoundValueRef<long>_> *in_stack_ffffffffffffffa8;
  long *in_stack_ffffffffffffffd8;
  
  ComposableParserImpl<Catch::Clara::Opt>::ComposableParserImpl
            ((ComposableParserImpl<Catch::Clara::Opt> *)in_RDI);
  (in_RDI->super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__ParserRefImpl_002a9308;
  *(undefined4 *)
   &(in_RDI->super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = 0;
  std::make_shared<Catch::Clara::Detail::BoundValueRef<long>,long&>(in_stack_ffffffffffffffd8);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::
  shared_ptr<Catch::Clara::Detail::BoundValueRef<long>,void>(in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<Catch::Clara::Detail::BoundValueRef<long>_>::~shared_ptr
            ((shared_ptr<Catch::Clara::Detail::BoundValueRef<long>_> *)0x20bfd0);
  in_RDI[2].super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDX;
  in_RDI[2].super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RCX;
  StringRef::StringRef((StringRef *)(in_RDI + 3));
  return;
}

Assistant:

ParserRefImpl( T& ref, StringRef hint ):
                    m_ref( std::make_shared<BoundValueRef<T>>( ref ) ),
                    m_hint( hint ) {}